

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O0

int __thiscall deci::ast_unary_t::Generate(ast_unary_t *this,ostream *output,int pc)

{
  int iVar1;
  ostream *poVar2;
  int pc_local;
  ostream *output_local;
  ast_unary_t *this_local;
  
  iVar1 = (*this->chain->_vptr_ast_item_t[2])(this->chain,output,(ulong)(uint)pc);
  poVar2 = std::operator<<(output,"unr ");
  poVar2 = std::operator<<(poVar2,(string *)&this->identifier);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return iVar1 + 1;
}

Assistant:

int ast_unary_t::Generate(std::ostream& output, int pc) const {
    pc = this->chain->Generate(output, pc);
    output << "unr " << this->identifier << std::endl;
    return pc + 1;
  }